

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

char * __thiscall
google::protobuf::SourceCodeInfo_Location::_InternalParse
          (SourceCodeInfo_Location *this,char *ptr,ParseContext *ctx)

{
  bool bVar1;
  string *s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_00;
  uint64 uVar2;
  char cVar3;
  RepeatedField<int> *object;
  uint32 tag;
  char *local_58;
  uint local_4c;
  InternalMetadataWithArena *local_48;
  RepeatedField<int> *local_40;
  RepeatedField<int> *local_38;
  
  local_48 = &this->_internal_metadata_;
  local_38 = &this->span_;
  local_40 = &this->path_;
  local_58 = ptr;
LAB_002b5e71:
  do {
    bVar1 = internal::ParseContext::Done(ctx,&local_58);
    if (bVar1) {
      return local_58;
    }
    local_58 = internal::ReadTag(local_58,&local_4c,0);
    if (local_58 == (char *)0x0) {
      return (char *)0x0;
    }
    cVar3 = (char)local_4c;
    switch(local_4c >> 3) {
    case 1:
      object = local_40;
      if (cVar3 == '\n') {
LAB_002b5ef0:
        local_58 = internal::PackedInt32Parser(object,local_58,ctx);
      }
      else {
        if ((local_4c & 0xff) != 8) break;
        uVar2 = internal::ReadVarint(&local_58);
        _internal_add_path(this,(int32)uVar2);
      }
      goto joined_r0x002b5fdb;
    case 2:
      object = local_38;
      if (cVar3 == '\x12') goto LAB_002b5ef0;
      if ((local_4c & 0xff) == 0x10) {
        uVar2 = internal::ReadVarint(&local_58);
        _internal_add_span(this,(int32)uVar2);
        goto joined_r0x002b5fdb;
      }
      break;
    case 3:
      if (cVar3 != '\x1a') break;
      s = _internal_mutable_leading_comments_abi_cxx11_(this);
LAB_002b5f12:
      local_58 = internal::InlineGreedyStringParser(s,local_58,ctx);
      goto joined_r0x002b5fdb;
    case 4:
      if (cVar3 == '\"') {
        s = _internal_mutable_trailing_comments_abi_cxx11_(this);
        goto LAB_002b5f12;
      }
      break;
    case 6:
      if (cVar3 == '2') {
        local_58 = local_58 + -1;
        do {
          local_58 = local_58 + 1;
          s_00 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::Add(&this->leading_detached_comments_);
          local_58 = internal::InlineGreedyStringParser(s_00,local_58,ctx);
          if (local_58 == (char *)0x0) {
            return (char *)0x0;
          }
        } while ((local_58 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_58 == '2'));
        goto LAB_002b5e71;
      }
    }
    if ((local_4c == 0) || ((local_4c & 7) == 4)) {
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = local_4c - 1;
      return local_58;
    }
    local_58 = internal::UnknownFieldParse(local_4c,local_48,local_58,ctx);
joined_r0x002b5fdb:
    if (local_58 == (char *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* SourceCodeInfo_Location::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArenaNoVirtual(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // repeated int32 path = 1 [packed = true];
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::PackedInt32Parser(_internal_mutable_path(), ptr, ctx);
          CHK_(ptr);
        } else if (static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 8) {
          _internal_add_path(::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr));
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated int32 span = 2 [packed = true];
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::PackedInt32Parser(_internal_mutable_span(), ptr, ctx);
          CHK_(ptr);
        } else if (static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 16) {
          _internal_add_span(::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr));
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string leading_comments = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 26)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_leading_comments(), ptr, ctx, "google.protobuf.SourceCodeInfo.Location.leading_comments");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string trailing_comments = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 34)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_trailing_comments(), ptr, ctx, "google.protobuf.SourceCodeInfo.Location.trailing_comments");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated string leading_detached_comments = 6;
      case 6:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 50)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_add_leading_detached_comments(), ptr, ctx, "google.protobuf.SourceCodeInfo.Location.leading_detached_comments");
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<50>(ptr));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}